

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapFields
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *message2_00;
  Message *message1_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GeneratedMessageReflection *pGVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  string *psVar6;
  size_type sVar7;
  const_reference ppFVar8;
  ExtensionSet *this_00;
  ExtensionSet *other;
  OneofDescriptor *pOVar9;
  int __c;
  char *pcVar10;
  _Self local_110;
  _Self local_108;
  key_type local_fc;
  FieldDescriptor *pFStack_f8;
  int oneof_index;
  FieldDescriptor *field;
  int i;
  int fields_size;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_28;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Message *message2_local;
  Message *message1_local;
  GeneratedMessageReflection *this_local;
  
  if (message1 != message2) {
    local_28 = fields;
    fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)message2;
    message2_local = message1;
    message1_local = (Message *)this;
    iVar2 = (*(message1->super_MessageLite)._vptr_MessageLite[0x16])();
    local_61 = 0;
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar2) != this) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x29d);
      local_61 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_60,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar4 = LogMessage::operator<<(pLVar4,"First argument to SwapFields() (of type \"");
      pDVar5 = Message::GetDescriptor(message2_local);
      psVar6 = Descriptor::full_name_abi_cxx11_(pDVar5);
      pLVar4 = LogMessage::operator<<(pLVar4,psVar6);
      pLVar4 = LogMessage::operator<<
                         (pLVar4,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar4 = LogMessage::operator<<(pLVar4,psVar6);
      pLVar4 = LogMessage::operator<<
                         (pLVar4,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=(local_75,pLVar4);
    }
    if ((local_61 & 1) != 0) {
      LogMessage::~LogMessage(&local_60);
    }
    pGVar3 = (GeneratedMessageReflection *)
             (*(code *)(fields_local->
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[0x16])();
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    if (pGVar3 != this) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2a4);
      swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_b0,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar4 = LogMessage::operator<<(pLVar4,"Second argument to SwapFields() (of type \"");
      pDVar5 = Message::GetDescriptor((Message *)fields_local);
      psVar6 = Descriptor::full_name_abi_cxx11_(pDVar5);
      pLVar4 = LogMessage::operator<<(pLVar4,psVar6);
      pLVar4 = LogMessage::operator<<
                         (pLVar4,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar4 = LogMessage::operator<<(pLVar4,psVar6);
      pLVar4 = LogMessage::operator<<
                         (pLVar4,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=
                ((LogFinisher *)
                 ((long)&swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count + 6),pLVar4)
      ;
    }
    if ((swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_b0);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i);
    sVar7 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(local_28);
    field._4_4_ = (int)sVar7;
    for (field._0_4_ = 0; (int)field < field._4_4_; field._0_4_ = (int)field + 1) {
      pcVar10 = (char *)(long)(int)field;
      ppFVar8 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](local_28,(size_type)pcVar10);
      pFStack_f8 = *ppFVar8;
      bVar1 = FieldDescriptor::is_extension(pFStack_f8);
      if (bVar1) {
        this_00 = MutableExtensionSet(this,message2_local);
        other = MutableExtensionSet(this,(Message *)fields_local);
        iVar2 = FieldDescriptor::number(pFStack_f8);
        ExtensionSet::SwapExtension(this_00,other,iVar2);
      }
      else {
        pOVar9 = FieldDescriptor::containing_oneof(pFStack_f8);
        if (pOVar9 == (OneofDescriptor *)0x0) {
          bVar1 = FieldDescriptor::is_repeated(pFStack_f8);
          if (!bVar1) {
            SwapBit(this,message2_local,(Message *)fields_local,pFStack_f8);
          }
          SwapField(this,message2_local,(Message *)fields_local,pFStack_f8);
        }
        else {
          pOVar9 = FieldDescriptor::containing_oneof(pFStack_f8);
          pcVar10 = OneofDescriptor::index(pOVar9,pcVar10,__c);
          local_fc = (key_type)pcVar10;
          local_108._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,&local_fc);
          local_110._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&i);
          bVar1 = std::operator!=(&local_108,&local_110);
          if (!bVar1) {
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,&local_fc);
            message1_00 = message2_local;
            message2_00 = fields_local;
            pOVar9 = FieldDescriptor::containing_oneof(pFStack_f8);
            SwapOneofField(this,message1_00,(Message *)message2_00,pOVar9);
          }
        }
      }
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapFields(
    Message* message1,
    Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to SwapFields() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to SwapFields() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  std::set<int> swapped_oneof;

  const int fields_size = static_cast<int>(fields.size());
  for (int i = 0; i < fields_size; i++) {
    const FieldDescriptor* field = fields[i];
    if (field->is_extension()) {
      MutableExtensionSet(message1)->SwapExtension(
          MutableExtensionSet(message2),
          field->number());
    } else {
      if (field->containing_oneof()) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField(message1, message2, field->containing_oneof());
      } else {
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
        // Swap field.
        SwapField(message1, message2, field);
      }
    }
  }
}